

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::assessPivot(HEkkPrimal *this)

{
  int iRow;
  
  iRow = this->row_out;
  this->alpha_col =
       (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iRow];
  this->variable_out =
       (this->ekk_instance_->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start[iRow];
  HEkk::unitBtran(this->ekk_instance_,iRow,&this->row_ep);
  HEkk::tableauRowPrice(this->ekk_instance_,false,&this->row_ep,&this->row_ap,-2);
  updateVerify(this);
  return;
}

Assistant:

void HEkkPrimal::assessPivot() {
  assert(row_out >= 0);
  // Record the pivot entry
  alpha_col = col_aq.array[row_out];
  variable_out = ekk_instance_.basis_.basicIndex_[row_out];

  // Compute the tableau row
  //
  // BTRAN
  //
  // Compute unit BTran for tableau row and FT update
  ekk_instance_.unitBtran(row_out, row_ep);
  //
  // PRICE
  //
  const bool quad_precision = false;
  ekk_instance_.tableauRowPrice(quad_precision, row_ep, row_ap);

  // Checks row-wise pivot against column-wise pivot for
  // numerical trouble
  //
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  updateVerify();
}